

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Binasc.cpp
# Opt level: O0

int __thiscall smf::Binasc::outputStyleAscii(Binasc *this,ostream *out,istream *input)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  ostream *poVar4;
  bool bVar5;
  byte local_135;
  int lastType;
  int iStack_130;
  uchar ch;
  int type;
  int lineCount;
  int index;
  uchar outputWord [256];
  istream *input_local;
  ostream *out_local;
  Binasc *this_local;
  
  memset(&lineCount,0,0x100);
  type = 0;
  iStack_130 = 0;
  local_135 = std::istream::get();
  bVar1 = false;
  while (bVar2 = std::ios::eof(), ((bVar2 ^ 0xff) & 1) != 0) {
    iVar3 = isprint((uint)local_135);
    bVar5 = false;
    if (iVar3 != 0) {
      iVar3 = isspace((uint)local_135);
      bVar5 = iVar3 == 0;
    }
    if ((bVar5) && (!bVar1)) {
      if (type + iStack_130 < this->m_maxLineLength) {
        *(undefined1 *)((long)&lineCount + (long)type) = 0;
        if (iStack_130 != 0) {
          std::operator<<(out,' ');
          iStack_130 = iStack_130 + 1;
        }
        std::operator<<(out,(uchar *)&lineCount);
        iStack_130 = type + iStack_130;
      }
      else {
        *(undefined1 *)((long)&lineCount + (long)type) = 0;
        poVar4 = std::operator<<(out,'\n');
        std::operator<<(poVar4,(uchar *)&lineCount);
        iStack_130 = type;
      }
      type = 0;
    }
    if (bVar5) {
      *(byte *)((long)&lineCount + (long)type) = local_135;
      type = type + 1;
    }
    local_135 = std::istream::get();
    bVar1 = bVar5;
  }
  if (type != 0) {
    std::ostream::operator<<(out,std::endl<char,std::char_traits<char>>);
  }
  return 1;
}

Assistant:

int Binasc::outputStyleAscii(std::ostream& out, std::istream& input) {
	uchar outputWord[256] = {0};   // storage for current word
	int index     = 0;             // current length of word
	int lineCount = 0;             // current length of line
	int type      = 0;             // 0=space, 1=printable
	uchar ch;                      // current input byte

	ch = input.get();
	while (!input.eof()) {
		int lastType = type;
		type = (isprint(ch) && !isspace(ch)) ? 1 : 0;

		if ((type == 1) && (lastType == 0)) {
			// start of a new word.  check where to put old word
			if (index + lineCount >= m_maxLineLength) {  // put on next line
				outputWord[index] = '\0';
				out << '\n' << outputWord;
				lineCount = index;
				index = 0;
			} else {                                   // put on current line
				outputWord[index] = '\0';
				if (lineCount != 0) {
					out << ' ';
					lineCount++;
				}
				out << outputWord;
				lineCount += index;
				index = 0;
			}
		}
		if (type == 1) {
			outputWord[index++] = ch;
		}
		ch = input.get();
	}

	if (index != 0) {
		out << std::endl;
	}

	return 1;
}